

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b10_sx_sy_w4_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar6 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined2 uVar13;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined1 auVar14 [16];
  
  auVar3 = _DAT_00c1e0d0;
  auVar4 = pmovsxbw(in_XMM4,0x4040404040404040);
  do {
    uVar1 = *(undefined8 *)mask;
    uVar2 = *(undefined8 *)(mask + mask_stride);
    auVar10[0] = (char)uVar2 + (char)uVar1;
    auVar10[1] = (char)((ulong)uVar2 >> 8) + (char)((ulong)uVar1 >> 8);
    auVar10[2] = (char)((ulong)uVar2 >> 0x10) + (char)((ulong)uVar1 >> 0x10);
    auVar10[3] = (char)((ulong)uVar2 >> 0x18) + (char)((ulong)uVar1 >> 0x18);
    auVar10[4] = (char)((ulong)uVar2 >> 0x20) + (char)((ulong)uVar1 >> 0x20);
    auVar10[5] = (char)((ulong)uVar2 >> 0x28) + (char)((ulong)uVar1 >> 0x28);
    auVar10[6] = (char)((ulong)uVar2 >> 0x30) + (char)((ulong)uVar1 >> 0x30);
    auVar10[7] = (char)((ulong)uVar2 >> 0x38) + (char)((ulong)uVar1 >> 0x38);
    auVar10._8_8_ = 0;
    auVar6 = pshufb(auVar10,ZEXT816(0xe0c0a0806040200));
    auVar10 = pshufb(auVar10,ZEXT816(0xf0d0b0907050301));
    auVar14 = auVar10 & auVar6;
    auVar10 = auVar10 ^ auVar6;
    auVar11._0_2_ = auVar10._0_2_ >> 1;
    auVar11._2_2_ = auVar10._2_2_ >> 1;
    auVar11._4_2_ = auVar10._4_2_ >> 1;
    auVar11._6_2_ = auVar10._6_2_ >> 1;
    auVar11._8_2_ = auVar10._8_2_ >> 1;
    auVar11._10_2_ = auVar10._10_2_ >> 1;
    auVar11._12_2_ = auVar10._12_2_ >> 1;
    auVar11._14_2_ = auVar10._14_2_ >> 1;
    auVar11 = auVar11 & auVar3;
    auVar12[0] = auVar11[0] + auVar14[0];
    auVar12[1] = auVar11[1] + auVar14[1];
    auVar12[2] = auVar11[2] + auVar14[2];
    auVar12[3] = auVar11[3] + auVar14[3];
    auVar12[4] = auVar11[4] + auVar14[4];
    auVar12[5] = auVar11[5] + auVar14[5];
    auVar12[6] = auVar11[6] + auVar14[6];
    auVar12[7] = auVar11[7] + auVar14[7];
    auVar12[8] = auVar11[8] + auVar14[8];
    auVar12[9] = auVar11[9] + auVar14[9];
    auVar12[10] = auVar11[10] + auVar14[10];
    auVar12[0xb] = auVar11[0xb] + auVar14[0xb];
    auVar12[0xc] = auVar11[0xc] + auVar14[0xc];
    auVar12[0xd] = auVar11[0xd] + auVar14[0xd];
    auVar12[0xe] = auVar11[0xe] + auVar14[0xe];
    auVar12[0xf] = auVar11[0xf] + auVar14[0xf];
    auVar6 = pmovzxbw(auVar6,auVar12);
    sVar5 = pavgw(auVar6._0_2_,0);
    sVar7 = pavgw(auVar6._2_2_,0);
    sVar8 = pavgw(auVar6._4_2_,0);
    sVar9 = pavgw(auVar6._6_2_,0);
    pavgw(auVar6._8_2_,0);
    pavgw(auVar6._10_2_,0);
    pavgw(auVar6._12_2_,0);
    pavgw(auVar6._14_2_,0);
    uVar1 = *(undefined8 *)src0;
    uVar2 = *(undefined8 *)src1;
    uVar13 = pavgw((ushort)((short)uVar1 * sVar5 + (short)uVar2 * (auVar4._0_2_ - sVar5)) >> 5,0);
    uVar15 = pavgw((ushort)((short)((ulong)uVar1 >> 0x10) * sVar7 +
                           (short)((ulong)uVar2 >> 0x10) * (auVar4._2_2_ - sVar7)) >> 5,0);
    uVar16 = pavgw((ushort)((short)((ulong)uVar1 >> 0x20) * sVar8 +
                           (short)((ulong)uVar2 >> 0x20) * (auVar4._4_2_ - sVar8)) >> 5,0);
    uVar17 = pavgw((ushort)((short)((ulong)uVar1 >> 0x30) * sVar9 +
                           (short)((ulong)uVar2 >> 0x30) * (auVar4._6_2_ - sVar9)) >> 5,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    pavgw(0,0);
    *(ulong *)dst = CONCAT26(uVar17,CONCAT24(uVar16,CONCAT22(uVar15,uVar13)));
    mask = mask + mask_stride * 2;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    dst = dst + dst_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_sy_w4_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;
  blend_a64_mask_bn_sx_sy_w4_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, h,
                                    blend_4_b10);
}